

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfImage.cpp
# Opt level: O0

void __thiscall
Imf_3_2::Image::insertChannel
          (Image *this,string *name,PixelType type,int xSampling,int ySampling,bool pLinear)

{
  mapped_type *pmVar1;
  long lVar2;
  long lVar3;
  ImageLevel **ppIVar4;
  uint in_ECX;
  PixelType in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  uint in_R8D;
  byte in_R9B;
  int x;
  int y;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int iVar5;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar6;
  undefined4 in_stack_ffffffffffffffc4;
  ChannelInfo local_30;
  byte local_1d;
  uint local_1c;
  uint local_18;
  PixelType local_14;
  undefined8 local_10;
  
  local_1d = in_R9B & 1;
  local_1c = in_R8D;
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  ChannelInfo::ChannelInfo(&local_30,in_EDX,in_ECX,in_R8D,(bool)local_1d);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo>_>_>
                         *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        (key_type *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  pmVar1->type = local_30.type;
  pmVar1->xSampling = local_30.xSampling;
  pmVar1->ySampling = local_30.ySampling;
  pmVar1->pLinear = local_30.pLinear;
  iVar6 = 0;
  while( true ) {
    lVar2 = (long)iVar6;
    lVar3 = Array2D<Imf_3_2::ImageLevel_*>::height
                      ((Array2D<Imf_3_2::ImageLevel_*> *)(in_RDI + 0x50));
    if (lVar3 <= lVar2) break;
    iVar5 = 0;
    while( true ) {
      lVar2 = (long)iVar5;
      lVar3 = Array2D<Imf_3_2::ImageLevel_*>::width
                        ((Array2D<Imf_3_2::ImageLevel_*> *)(in_RDI + 0x50));
      if (lVar3 <= lVar2) break;
      ppIVar4 = Array2D<Imf_3_2::ImageLevel_*>::operator[]
                          ((Array2D<Imf_3_2::ImageLevel_*> *)(in_RDI + 0x50),(long)iVar6);
      if (ppIVar4[iVar5] != (ImageLevel *)0x0) {
        ppIVar4 = Array2D<Imf_3_2::ImageLevel_*>::operator[]
                            ((Array2D<Imf_3_2::ImageLevel_*> *)(in_RDI + 0x50),(long)iVar6);
        (*ppIVar4[iVar5]->_vptr_ImageLevel[4])
                  (ppIVar4[iVar5],local_10,(ulong)local_14,(ulong)local_18,(ulong)local_1c,
                   (ulong)(local_1d & 1));
      }
      iVar5 = iVar5 + 1;
    }
    iVar6 = iVar6 + 1;
  }
  return;
}

Assistant:

void
Image::insertChannel (
    const std::string& name,
    PixelType          type,
    int                xSampling,
    int                ySampling,
    bool               pLinear)
{
    try
    {
        _channels[name] = ChannelInfo (type, xSampling, ySampling, pLinear);

        for (int y = 0; y < _levels.height (); ++y)
            for (int x = 0; x < _levels.width (); ++x)
                if (_levels[y][x])
                    _levels[y][x]->insertChannel (
                        name, type, xSampling, ySampling, pLinear);
    }
    catch (...)
    {
        eraseChannel (name);
        throw;
    }
}